

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O2

void __thiscall csv::internals::IBasicCSVParser::reset_data_ptr(IBasicCSVParser *this)

{
  __shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<csv::internals::RawCSVData>();
  std::__shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->data_ptr).
              super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  memcpy(&((this->data_ptr).
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parse_flags,&this->_parse_flags,0x400);
  std::__shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->data_ptr).
                super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              col_names).super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>,
             &(this->_col_names).
              super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>);
  this->fields = &((this->data_ptr).
                   super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->fields;
  return;
}

Assistant:

CSV_INLINE void IBasicCSVParser::reset_data_ptr() {
            this->data_ptr = std::make_shared<RawCSVData>();
            this->data_ptr->parse_flags = this->_parse_flags;
            this->data_ptr->col_names = this->_col_names;
            this->fields = &(this->data_ptr->fields);
        }